

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O2

bool __thiscall
slang::ast::Expression::
visitExpression<slang::ast::Expression_const,slang::ast::ConstraintExprVisitor&>
          (Expression *this,Expression *expr,ConstraintExprVisitor *visitor)

{
  bool bVar1;
  logic_error *this_00;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  switch(expr->kind) {
  case Invalid:
    visitor->failed = true;
    return false;
  case IntegerLiteral:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::IntegerLiteral>(visitor,(IntegerLiteral *)expr)
    ;
    return bVar1;
  case RealLiteral:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::RealLiteral>(visitor,(RealLiteral *)expr);
    return bVar1;
  case TimeLiteral:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::TimeLiteral>(visitor,(TimeLiteral *)expr);
    return bVar1;
  case UnbasedUnsizedIntegerLiteral:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::UnbasedUnsizedIntegerLiteral>
                      (visitor,(UnbasedUnsizedIntegerLiteral *)expr);
    return bVar1;
  case NullLiteral:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::NullLiteral>(visitor,(NullLiteral *)expr);
    return bVar1;
  case UnboundedLiteral:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::UnboundedLiteral>
                      (visitor,(UnboundedLiteral *)expr);
    return bVar1;
  case StringLiteral:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::StringLiteral>(visitor,(StringLiteral *)expr);
    return bVar1;
  case NamedValue:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::NamedValueExpression>
                      (visitor,(NamedValueExpression *)expr);
    return bVar1;
  case HierarchicalValue:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::HierarchicalValueExpression>
                      (visitor,(HierarchicalValueExpression *)expr);
    return bVar1;
  case UnaryOp:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::UnaryExpression>
                      (visitor,(UnaryExpression *)expr);
    return bVar1;
  case BinaryOp:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::BinaryExpression>
                      (visitor,(BinaryExpression *)expr);
    return bVar1;
  case ConditionalOp:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::ConditionalExpression>
                      (visitor,(ConditionalExpression *)expr);
    return bVar1;
  case Inside:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::InsideExpression>
                      (visitor,(InsideExpression *)expr);
    return bVar1;
  case Assignment:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::AssignmentExpression>
                      (visitor,(AssignmentExpression *)expr);
    return bVar1;
  case Concatenation:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::ConcatenationExpression>
                      (visitor,(ConcatenationExpression *)expr);
    return bVar1;
  case Replication:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::ReplicationExpression>
                      (visitor,(ReplicationExpression *)expr);
    return bVar1;
  case Streaming:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::StreamingConcatenationExpression>
                      (visitor,(StreamingConcatenationExpression *)expr);
    return bVar1;
  case ElementSelect:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::ElementSelectExpression>
                      (visitor,(ElementSelectExpression *)expr);
    return bVar1;
  case RangeSelect:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::RangeSelectExpression>
                      (visitor,(RangeSelectExpression *)expr);
    return bVar1;
  case MemberAccess:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::MemberAccessExpression>
                      (visitor,(MemberAccessExpression *)expr);
    return bVar1;
  case Call:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::CallExpression>(visitor,(CallExpression *)expr)
    ;
    return bVar1;
  case Conversion:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::ConversionExpression>
                      (visitor,(ConversionExpression *)expr);
    return bVar1;
  case DataType:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::DataTypeExpression>
                      (visitor,(DataTypeExpression *)expr);
    return bVar1;
  case TypeReference:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::TypeReferenceExpression>
                      (visitor,(TypeReferenceExpression *)expr);
    return bVar1;
  case HierarchicalReference:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::HierarchicalReferenceExpression>
                      (visitor,(HierarchicalReferenceExpression *)expr);
    return bVar1;
  case LValueReference:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::LValueReferenceExpression>
                      (visitor,(LValueReferenceExpression *)expr);
    return bVar1;
  case SimpleAssignmentPattern:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::SimpleAssignmentPatternExpression>
                      (visitor,(SimpleAssignmentPatternExpression *)expr);
    return bVar1;
  case StructuredAssignmentPattern:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::StructuredAssignmentPatternExpression>
                      (visitor,(StructuredAssignmentPatternExpression *)expr);
    return bVar1;
  case ReplicatedAssignmentPattern:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::ReplicatedAssignmentPatternExpression>
                      (visitor,(ReplicatedAssignmentPatternExpression *)expr);
    return bVar1;
  case EmptyArgument:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::EmptyArgumentExpression>
                      (visitor,(EmptyArgumentExpression *)expr);
    return bVar1;
  case OpenRange:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::OpenRangeExpression>
                      (visitor,(OpenRangeExpression *)expr);
    return bVar1;
  case Dist:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::DistExpression>(visitor,(DistExpression *)expr)
    ;
    return bVar1;
  case NewArray:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::NewArrayExpression>
                      (visitor,(NewArrayExpression *)expr);
    return bVar1;
  case NewClass:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::NewClassExpression>
                      (visitor,(NewClassExpression *)expr);
    return bVar1;
  case NewCovergroup:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::NewCovergroupExpression>
                      (visitor,(NewCovergroupExpression *)expr);
    return bVar1;
  case CopyClass:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::CopyClassExpression>
                      (visitor,(CopyClassExpression *)expr);
    return bVar1;
  case MinTypMax:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::MinTypMaxExpression>
                      (visitor,(MinTypMaxExpression *)expr);
    return bVar1;
  case ClockingEvent:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::ClockingEventExpression>
                      (visitor,(ClockingEventExpression *)expr);
    return bVar1;
  case AssertionInstance:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::AssertionInstanceExpression>
                      (visitor,(AssertionInstanceExpression *)expr);
    return bVar1;
  case TaggedUnion:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::TaggedUnionExpression>
                      (visitor,(TaggedUnionExpression *)expr);
    return bVar1;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
               ,&local_d9);
    std::operator+(&local_98,&local_b8,":");
    std::__cxx11::to_string(&local_d8,0x15b);
    std::operator+(&local_78,&local_98,&local_d8);
    std::operator+(&local_58,&local_78,": ");
    std::operator+(&local_38,&local_58,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_38);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
}

Assistant:

decltype(auto) Expression::visitExpression(TExpression* expr, TVisitor&& visitor,
                                           Args&&... args) const {
    // clang-format off
#define CASE(k, n) case ExpressionKind::k: return visitor.visit(\
                        *static_cast<std::conditional_t<std::is_const_v<TExpression>, const n*, n*>>(expr),\
                            std::forward<Args>(args)...)

    switch (expr->kind) {
        case ExpressionKind::Invalid: return visitor.visitInvalid(*expr, std::forward<Args>(args)...);
        CASE(IntegerLiteral, IntegerLiteral);
        CASE(RealLiteral, RealLiteral);
        CASE(TimeLiteral, TimeLiteral);
        CASE(UnbasedUnsizedIntegerLiteral, UnbasedUnsizedIntegerLiteral);
        CASE(NullLiteral, NullLiteral);
        CASE(UnboundedLiteral, UnboundedLiteral);
        CASE(StringLiteral, StringLiteral);
        CASE(NamedValue, NamedValueExpression);
        CASE(HierarchicalValue, HierarchicalValueExpression);
        CASE(UnaryOp, UnaryExpression);
        CASE(BinaryOp, BinaryExpression);
        CASE(ConditionalOp, ConditionalExpression);
        CASE(Inside, InsideExpression);
        CASE(Assignment, AssignmentExpression);
        CASE(Concatenation, ConcatenationExpression);
        CASE(Replication, ReplicationExpression);
        CASE(Streaming, StreamingConcatenationExpression);
        CASE(ElementSelect, ElementSelectExpression);
        CASE(RangeSelect, RangeSelectExpression);
        CASE(MemberAccess, MemberAccessExpression);
        CASE(Call, CallExpression);
        CASE(Conversion, ConversionExpression);
        CASE(DataType, DataTypeExpression);
        CASE(TypeReference, TypeReferenceExpression);
        CASE(HierarchicalReference, HierarchicalReferenceExpression);
        CASE(LValueReference, LValueReferenceExpression);
        CASE(SimpleAssignmentPattern, SimpleAssignmentPatternExpression);
        CASE(StructuredAssignmentPattern, StructuredAssignmentPatternExpression);
        CASE(ReplicatedAssignmentPattern, ReplicatedAssignmentPatternExpression);
        CASE(EmptyArgument, EmptyArgumentExpression);
        CASE(OpenRange, OpenRangeExpression);
        CASE(Dist, DistExpression);
        CASE(NewArray, NewArrayExpression);
        CASE(NewClass, NewClassExpression);
        CASE(NewCovergroup, NewCovergroupExpression);
        CASE(CopyClass, CopyClassExpression);
        CASE(MinTypMax, MinTypMaxExpression);
        CASE(ClockingEvent, ClockingEventExpression);
        CASE(AssertionInstance, AssertionInstanceExpression);
        CASE(TaggedUnion, TaggedUnionExpression);
    }
#undef CASE
    // clang-format on
    ASSUME_UNREACHABLE;
}